

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_151d8d0::GetSseSum8x8QuadTest_DISABLED_Speed_Test::TestBody
          (GetSseSum8x8QuadTest_DISABLED_Speed_Test *this)

{
  MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>
  *in_stack_000000f8;
  
  MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>
  ::SseSum_SpeedTest(in_stack_000000f8);
  return;
}

Assistant:

TEST_P(GetSseSum8x8QuadTest, DISABLED_Speed) { SseSum_SpeedTest(); }